

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  lemon *lemp;
  lemon *lemp_00;
  ushort **ppuVar3;
  lemon *lemp_01;
  rule *rp;
  lemon lem;
  int exitcode;
  int i;
  int in_stack_000003e8;
  int in_stack_000003ec;
  lemon *in_stack_000003f0;
  lemon *in_stack_000006b0;
  lemon *in_stack_00003e20;
  int in_stack_fffffffffffffebc;
  FILE *in_stack_fffffffffffffec0;
  rule *prVar4;
  s_options *in_stack_fffffffffffffec8;
  rule *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int local_118;
  lemon *in_stack_ffffffffffffff00;
  uint local_40;
  int iVar5;
  int local_14;
  
  OptInit((char **)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  if (main::version != 0) {
    printf("Lemon version 1.0\n");
    exit(0);
  }
  iVar1 = OptNArgs();
  if (iVar1 != 1) {
    fprintf(_stderr,"Exactly one filename argument is required.\n");
    exit(1);
  }
  memset(&stack0xfffffffffffffec8,0,0x120);
  Strsafe_init();
  Symbol_init();
  State_init();
  OptArg((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  iVar1 = main::basisflag;
  iVar5 = main::printPP;
  Symbol_new((char *)in_stack_fffffffffffffec0);
  Parse(in_stack_00003e20);
  if (iVar5 != 0) {
    exit(0);
  }
  if (local_118 != 0) {
    lemp = (lemon *)Symbol_find((char *)in_stack_fffffffffffffec8);
    Symbol_new((char *)in_stack_fffffffffffffec0);
    iVar2 = Symbol_count();
    lemp_00 = (lemon *)Symbol_arrayof();
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      ((symbol *)(&lemp_00->sorted)[local_14])->index = local_14;
    }
    qsort(lemp_00,(long)iVar2,8,Symbolcmpp);
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      ((symbol *)(&lemp_00->sorted)[local_14])->index = local_14;
    }
    while (((symbol *)(&lemp_00->sorted)[local_14 + -1])->type == MULTITERMINAL) {
      local_14 = local_14 + -1;
    }
    local_14 = 1;
    while (iVar2 = local_14, ppuVar3 = __ctype_b_loc(),
          ((*ppuVar3)[(int)(uint)(byte)*((symbol *)(&lemp_00->sorted)[local_14])->name] & 0x100) !=
          0) {
      local_14 = local_14 + 1;
    }
    local_14 = 0;
    for (prVar4 = in_stack_fffffffffffffed0; prVar4 != (rule *)0x0; prVar4 = prVar4->next) {
      if (prVar4->code == (char *)0x0) {
        in_stack_fffffffffffffebc = -1;
      }
      else {
        in_stack_fffffffffffffebc = local_14;
        local_14 = local_14 + 1;
      }
      prVar4->iRule = in_stack_fffffffffffffebc;
    }
    for (; in_stack_fffffffffffffed0 != (rule *)0x0;
        in_stack_fffffffffffffed0 = in_stack_fffffffffffffed0->next) {
      if (in_stack_fffffffffffffed0->iRule < 0) {
        in_stack_fffffffffffffed0->iRule = local_14;
        local_14 = local_14 + 1;
      }
    }
    lemp_01 = (lemon *)Rule_sort((rule *)CONCAT44(iVar5,iVar1));
    if (main::rpflag == 0) {
      SetSize(iVar2 + 1);
      FindRulePrecedences((lemon *)&stack0xfffffffffffffec8);
      FindFirstSets((lemon *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      iVar1 = 0;
      FindStates(lemp_01);
      State_arrayof();
      FindLinks((lemon *)CONCAT44(in_stack_fffffffffffffee4,iVar1));
      FindFollowSets(lemp_01);
      FindActions(in_stack_ffffffffffffff00);
      if (main::compress == 0) {
        CompressTables(lemp_00);
      }
      if (main::noResort == 0) {
        ResortStates(lemp_01);
      }
      if (main::quiet == 0) {
        ReportOutput(lemp);
      }
      ReportTable(in_stack_000003f0,in_stack_000003ec,in_stack_000003e8);
      if (main::mhflag == 0) {
        ReportHeader(in_stack_000006b0);
      }
    }
    else {
      Reprint((lemon *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    if (main::statistics != 0) {
      printf("Parser statistics:\n");
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
      stats_line((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffebc);
    }
    if (0 < (int)local_40) {
      fprintf(_stderr,"%d parsing conflicts.\n",(ulong)local_40);
    }
    exit((uint)(0 < (int)local_40));
  }
  fprintf(_stderr,"Empty grammar.\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
  static int version = 0;
  static int rpflag = 0;
  static int basisflag = 0;
  static int compress = 0;
  static int quiet = 0;
  static int statistics = 0;
  static int mhflag = 0;
  static int nolinenosflag = 0;
  static int noResort = 0;
  static int sqlFlag = 0;
  static int printPP = 0;
  
  static struct s_options options[] = {
    {OPT_FLAG, "b", (char*)&basisflag, "Print only the basis in report."},
    {OPT_FLAG, "c", (char*)&compress, "Don't compress the action table."},
    {OPT_FSTR, "d", (char*)&handle_d_option, "Output directory.  Default '.'"},
    {OPT_FSTR, "D", (char*)handle_D_option, "Define an %ifdef macro."},
    {OPT_FLAG, "E", (char*)&printPP, "Print input file after preprocessing."},
    {OPT_FSTR, "f", 0, "Ignored.  (Placeholder for -f compiler options.)"},
    {OPT_FLAG, "g", (char*)&rpflag, "Print grammar without actions."},
    {OPT_FSTR, "I", 0, "Ignored.  (Placeholder for '-I' compiler options.)"},
    {OPT_FLAG, "m", (char*)&mhflag, "Output a makeheaders compatible file."},
    {OPT_FLAG, "l", (char*)&nolinenosflag, "Do not print #line statements."},
    {OPT_FSTR, "O", 0, "Ignored.  (Placeholder for '-O' compiler options.)"},
    {OPT_FLAG, "p", (char*)&showPrecedenceConflict,
                    "Show conflicts resolved by precedence rules"},
    {OPT_FLAG, "q", (char*)&quiet, "(Quiet) Don't print the report file."},
    {OPT_FLAG, "r", (char*)&noResort, "Do not sort or renumber states"},
    {OPT_FLAG, "s", (char*)&statistics,
                                   "Print parser stats to standard output."},
    {OPT_FLAG, "S", (char*)&sqlFlag,
                    "Generate the *.sql file describing the parser tables."},
    {OPT_FLAG, "x", (char*)&version, "Print the version number."},
    {OPT_FSTR, "T", (char*)handle_T_option, "Specify a template file."},
    {OPT_FSTR, "W", 0, "Ignored.  (Placeholder for '-W' compiler options.)"},
    {OPT_FLAG,0,0,0}
  };
  int i;
  int exitcode;
  struct lemon lem;
  struct rule *rp;

  OptInit(argv,options,stderr);
  if( version ){
     printf("Lemon version 1.0\n");
     exit(0);
  }
  if( OptNArgs()!=1 ){
    fprintf(stderr,"Exactly one filename argument is required.\n");
    exit(1);
  }
  memset(&lem, 0, sizeof(lem));
  lem.errorcnt = 0;

  /* Initialize the machine */
  Strsafe_init();
  Symbol_init();
  State_init();
  lem.argv0 = argv[0];
  lem.filename = OptArg(0);
  lem.basisflag = basisflag;
  lem.nolinenosflag = nolinenosflag;
  lem.printPreprocessed = printPP;
  Symbol_new("$");

  /* Parse the input file */
  Parse(&lem);
  if( lem.printPreprocessed || lem.errorcnt ) exit(lem.errorcnt);
  if( lem.nrule==0 ){
    fprintf(stderr,"Empty grammar.\n");
    exit(1);
  }
  lem.errsym = Symbol_find("error");

  /* Count and index the symbols of the grammar */
  Symbol_new("{default}");
  lem.nsymbol = Symbol_count();
  lem.symbols = Symbol_arrayof();
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  qsort(lem.symbols,lem.nsymbol,sizeof(struct symbol*), Symbolcmpp);
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  while( lem.symbols[i-1]->type==MULTITERMINAL ){ i--; }
  assert( strcmp(lem.symbols[i-1]->name,"{default}")==0 );
  lem.nsymbol = i - 1;
  for(i=1; ISUPPER(lem.symbols[i]->name[0]); i++);
  lem.nterminal = i;

  /* Assign sequential rule numbers.  Start with 0.  Put rules that have no
  ** reduce action C-code associated with them last, so that the switch()
  ** statement that selects reduction actions will have a smaller jump table.
  */
  for(i=0, rp=lem.rule; rp; rp=rp->next){
    rp->iRule = rp->code ? i++ : -1;
  }
  lem.nruleWithAction = i;
  for(rp=lem.rule; rp; rp=rp->next){
    if( rp->iRule<0 ) rp->iRule = i++;
  }
  lem.startRule = lem.rule;
  lem.rule = Rule_sort(lem.rule);

  /* Generate a reprint of the grammar, if requested on the command line */
  if( rpflag ){
    Reprint(&lem);
  }else{
    /* Initialize the size for all follow and first sets */
    SetSize(lem.nterminal+1);

    /* Find the precedence for every production rule (that has one) */
    FindRulePrecedences(&lem);

    /* Compute the lambda-nonterminals and the first-sets for every
    ** nonterminal */
    FindFirstSets(&lem);

    /* Compute all LR(0) states.  Also record follow-set propagation
    ** links so that the follow-set can be computed later */
    lem.nstate = 0;
    FindStates(&lem);
    lem.sorted = State_arrayof();

    /* Tie up loose ends on the propagation links */
    FindLinks(&lem);

    /* Compute the follow set of every reducible configuration */
    FindFollowSets(&lem);

    /* Compute the action tables */
    FindActions(&lem);

    /* Compress the action tables */
    if( compress==0 ) CompressTables(&lem);

    /* Reorder and renumber the states so that states with fewer choices
    ** occur at the end.  This is an optimization that helps make the
    ** generated parser tables smaller. */
    if( noResort==0 ) ResortStates(&lem);

    /* Generate a report of the parser generated.  (the "y.output" file) */
    if( !quiet ) ReportOutput(&lem);

    /* Generate the source code for the parser */
    ReportTable(&lem, mhflag, sqlFlag);

    /* Produce a header file for use by the scanner.  (This step is
    ** omitted if the "-m" option is used because makeheaders will
    ** generate the file for us.) */
    if( !mhflag ) ReportHeader(&lem);
  }
  if( statistics ){
    printf("Parser statistics:\n");
    stats_line("terminal symbols", lem.nterminal);
    stats_line("non-terminal symbols", lem.nsymbol - lem.nterminal);
    stats_line("total symbols", lem.nsymbol);
    stats_line("rules", lem.nrule);
    stats_line("states", lem.nxstate);
    stats_line("conflicts", lem.nconflict);
    stats_line("action table entries", lem.nactiontab);
    stats_line("lookahead table entries", lem.nlookaheadtab);
    stats_line("total table size (bytes)", lem.tablesize);
  }
  if( lem.nconflict > 0 ){
    fprintf(stderr,"%d parsing conflicts.\n",lem.nconflict);
  }

  /* return 0 on success, 1 on failure. */
  exitcode = ((lem.errorcnt > 0) || (lem.nconflict > 0)) ? 1 : 0;
  exit(exitcode);
  return (exitcode);
}